

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O2

void __thiscall xray_re::xr_ini_writer::open_section(xr_ini_writer *this,string *format,...)

{
  char in_AL;
  int iVar1;
  size_type sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  _Elt_pointer pbVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string section;
  string prev_section;
  va_list ap;
  char buf [1024];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  undefined8 local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char local_418 [1024];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e0 = &stack0x00000008;
  local_4e8 = 0x3000000010;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  iVar1 = vsnprintf(local_418,0x400,(format->_M_dataplus)._M_p,&local_4e8);
  if (iVar1 != 0) {
    local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
    local_508._M_string_length = 0;
    local_508.field_2._M_local_buf[0] = '\0';
    sVar2 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->m_section_stack).c);
    if (sVar2 != 0) {
      pbVar3 = (this->m_section_stack).c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pbVar3 == (this->m_section_stack).c.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar3 = (this->m_section_stack).c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::operator+(&local_548,pbVar3 + -1,"_");
      std::__cxx11::string::operator=((string *)&local_508,(string *)&local_548);
      std::__cxx11::string::~string((string *)&local_548);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_568,local_418,(allocator<char> *)&local_528);
    std::operator+(&local_548,&local_508,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::operator+(&local_528,"[",&local_548);
    std::operator+(&local_568,&local_528,"]\n");
    xr_writer::w_sf((xr_writer *)this,local_568._M_dataplus._M_p,&local_4e8);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_528);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->m_section_stack).c,&local_548);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::~string((string *)&local_508);
  }
  return;
}

Assistant:

void xr_ini_writer::open_section(std::string format, ...)
{
	va_list ap;
	va_start(ap, format);

	char buf[1024];
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(buf, sizeof(buf), format.c_str(), ap);
#else
	int n = vsnprintf(buf, sizeof(buf), format.c_str(), ap);
#endif
	va_end(ap);
	if (n == 0)
		return;

	std::string prev_section;
	if (m_section_stack.size() > 0)
		prev_section = m_section_stack.top() + "_";

	std::string section(prev_section + std::string(buf));

	w_sf(("[" + section + "]\n").c_str(), ap);

	m_section_stack.push(section);

	va_end(ap);
}